

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma_back.c
# Opt level: O0

void parse_renouveau_startup(state *s,char *path)

{
  FILE *__stream;
  FILE *pFVar1;
  FILE *__stream_00;
  int *piVar2;
  char *pcVar3;
  FILE *f;
  char *buf;
  char *path_local;
  state *s_local;
  
  f = (FILE *)0x0;
  buf = path;
  path_local = (char *)s;
  asprintf((char **)&f,"%s/card_%04x-%04x_test_startup.txt",path,(ulong)(s->pci_id >> 0x10),
           (ulong)(s->pci_id & 0xffff));
  __stream_00 = fopen((char *)f,"r");
  pFVar1 = f;
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(__stream,"Couldn\'t open %s: %s\n",pFVar1,pcVar3);
  }
  else {
    dedma((state *)path_local,(FILE *)__stream_00,true);
    fclose(__stream_00);
  }
  free(f);
  return;
}

Assistant:

void
parse_renouveau_startup(struct state *s, char *path)
{
	char *buf = NULL;
	FILE *f;

	asprintf(&buf, "%s/card_%04x-%04x_test_startup.txt", path,
		 s->pci_id >> 16, s->pci_id & 0xffff);
	f = fopen(buf, "r");
	if (!f) {
		fprintf(stderr, "Couldn't open %s: %s\n", buf,
			strerror(errno));
		goto out;
	}

	dedma(s, f, true);

	fclose(f);
out:
	free(buf);
}